

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t strIsNumeric(char *str)

{
  char cVar1;
  
  do {
    cVar1 = *str;
    if (cVar1 == '\0') {
      return 1;
    }
    str = str + 1;
  } while (0xf5 < (byte)(cVar1 - 0x3aU));
  return 0;
}

Assistant:

bool_t strIsNumeric(const char* str)
{
	ASSERT(strIsValid(str));
	for (; *str; ++str)
		if (*str < '0' || *str > '9')
			return FALSE;
	return TRUE;
}